

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPSession::SetDefaultTimestampIncrement(RTPSession *this,uint32_t timestampinc)

{
  int iVar1;
  
  if (this->created == true) {
    if ((this->packetbuilder).init == true) {
      (this->packetbuilder).deftsset = true;
      (this->packetbuilder).defaulttimestampinc = timestampinc;
      return 0;
    }
    iVar1 = -0x14;
  }
  else {
    iVar1 = -0x3e;
  }
  return iVar1;
}

Assistant:

int RTPSession::SetDefaultTimestampIncrement(uint32_t timestampinc)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	int status;

	BUILDER_LOCK
	status = packetbuilder.SetDefaultTimestampIncrement(timestampinc);
	BUILDER_UNLOCK
	return status;
}